

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

char * zt_cstr_dup(char *s,ssize_t i,ssize_t j,ssize_t n)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (s == (char *)0x0) {
    return (char *)0x0;
  }
  sVar2 = strlen(s);
  if (sVar2 == 0) {
    lVar8 = 0;
    lVar7 = 0;
  }
  else {
    if (i < 0) {
      lVar6 = sVar2 - 1;
      if ((long)(i + sVar2) < (long)sVar2) {
        lVar6 = i + sVar2;
      }
    }
    else {
      lVar6 = sVar2 - 1;
      if (i < (long)sVar2) {
        lVar6 = i;
      }
    }
    if (j < 0) {
      lVar7 = sVar2 - 1;
      if ((long)(j + sVar2) < (long)sVar2) {
        lVar7 = j + sVar2;
      }
    }
    else {
      lVar7 = sVar2 - 1;
      if (j < (long)sVar2) {
        lVar7 = j;
      }
    }
    lVar8 = lVar7;
    if (lVar7 < lVar6) {
      lVar8 = lVar6;
    }
    if (lVar6 < lVar7) {
      lVar7 = lVar6;
    }
  }
  lVar3 = lVar7 - lVar8;
  lVar6 = -lVar3;
  if (0 < lVar3) {
    lVar6 = lVar3;
  }
  pcVar4 = (char *)zt_malloc_p((lVar6 + 1) * n + 1);
  pcVar5 = pcVar4;
  if (0 < n) {
    do {
      if (lVar7 <= lVar8) {
        lVar6 = 0;
        do {
          pcVar5[lVar6] = s[lVar6 + lVar7];
          lVar6 = lVar6 + 1;
        } while ((lVar8 - lVar7) + 1 != lVar6);
        pcVar5 = pcVar5 + lVar6;
      }
      bVar1 = 1 < n;
      n = n + -1;
    } while (bVar1);
  }
  *pcVar5 = '\0';
  return pcVar4;
}

Assistant:

char *
zt_cstr_dup(const char *s, ssize_t i, ssize_t j, ssize_t n) {
    ssize_t   k;
    char    * new;
    char    * p;

    zt_assert(n >= 0);

    if (!s) {
        return NULL;
    }

    CONVERT(s, i, j);

    p = new = zt_malloc(char, (n * IDXLEN(i, j)) + 1);

    if (IDXLEN(i, j) > 0) {
        while (n-- > 0) {
            for (k = i; k <= j; k++) {
                *p++ = s[k];
            }
        }
    }

    *p = '\0';

    return new;
}